

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

void __thiscall
wallet::DescriptorScriptPubKeyMan::UpdateWalletDescriptor
          (DescriptorScriptPubKeyMan *this,WalletDescriptor *descriptor)

{
  long lVar1;
  bool bVar2;
  runtime_error *this_00;
  long in_FS_OFFSET;
  allocator<char> local_b1;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string error;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock80,&this->cs_desc_man,"cs_desc_man",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
             ,0xad9,false);
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  bVar2 = CanUpdateToWalletDescriptor(this,descriptor,&error);
  if (bVar2) {
    std::
    _Rb_tree<CPubKey,_std::pair<const_CPubKey,_int>,_std::_Select1st<std::pair<const_CPubKey,_int>_>,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_int>_>_>
    ::clear(&(this->m_map_pubkeys)._M_t);
    std::
    _Rb_tree<CScript,_std::pair<const_CScript,_int>,_std::_Select1st<std::pair<const_CScript,_int>_>,_std::less<CScript>,_std::allocator<std::pair<const_CScript,_int>_>_>
    ::clear(&(this->m_map_script_pub_keys)._M_t);
    this->m_max_cached_index = -1;
    WalletDescriptor::operator=(&this->m_wallet_descriptor,descriptor);
    boost::signals2::
    signal<void_(const_wallet::ScriptPubKeyMan_*,_long),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_wallet::ScriptPubKeyMan_*,_long)>,_boost::function<void_(const_boost::signals2::connection_&,_const_wallet::ScriptPubKeyMan_*,_long)>,_boost::signals2::mutex>
    ::operator()(&(this->super_ScriptPubKeyMan).NotifyFirstKeyTimeChanged,
                 &this->super_ScriptPubKeyMan,(this->m_wallet_descriptor).creation_time);
    std::__cxx11::string::~string((string *)&error);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock80.super_unique_lock);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"UpdateWalletDescriptor",&local_b1);
    std::operator+(&local_80,&local_a0,": ");
    std::operator+(&local_60,&local_80,&error);
    std::runtime_error::runtime_error(this_00,(string *)&local_60);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

void DescriptorScriptPubKeyMan::UpdateWalletDescriptor(WalletDescriptor& descriptor)
{
    LOCK(cs_desc_man);
    std::string error;
    if (!CanUpdateToWalletDescriptor(descriptor, error)) {
        throw std::runtime_error(std::string(__func__) + ": " + error);
    }

    m_map_pubkeys.clear();
    m_map_script_pub_keys.clear();
    m_max_cached_index = -1;
    m_wallet_descriptor = descriptor;

    NotifyFirstKeyTimeChanged(this, m_wallet_descriptor.creation_time);
}